

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::X3DImporter::FindNodeElement_FromRoot
          (X3DImporter *this,string *pID,EType pType,CX3DImporter_NodeElement **pElement)

{
  __type _Var1;
  _List_node_base *p_Var2;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar3;
  
  plVar3 = &this->NodeElement_List;
  p_Var2 = (_List_node_base *)plVar3;
  do {
    do {
      p_Var2 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var2 == (_List_node_base *)plVar3) goto LAB_005309ce;
    } while (*(EType *)((long)p_Var2[1]._M_next + 8) != pType);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)p_Var2[1]._M_next + 0x10),pID);
  } while (!_Var1);
  if (pElement != (CX3DImporter_NodeElement **)0x0) {
    *pElement = (CX3DImporter_NodeElement *)p_Var2[1]._M_next;
  }
LAB_005309ce:
  return p_Var2 != (_List_node_base *)plVar3;
}

Assistant:

bool X3DImporter::FindNodeElement_FromRoot(const std::string& pID, const CX3DImporter_NodeElement::EType pType, CX3DImporter_NodeElement** pElement)
{
	for(std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); ++it)
	{
		if(((*it)->Type == pType) && ((*it)->ID == pID))
		{
			if(pElement != nullptr) *pElement = *it;

			return true;
		}
	}// for(std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); it++)

	return false;
}